

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::WriteTopLevelProject
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *pcVar2;
  size_type sVar3;
  pointer pcVar4;
  char cVar5;
  bool bVar6;
  char *pcVar7;
  size_t sVar8;
  ostream *poVar9;
  size_type sVar10;
  string local_40;
  
  WriteFileHeader(this,fout);
  WriteMacros(this,fout,root);
  WriteHighLevelDirectives(this,root,fout);
  GhsMultiGpj::WriteGpjTag(PROJECT,fout);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"# Top Level Project File",0x18);
  cVar5 = (char)fout;
  std::ios::widen((char)fout->_vptr_basic_ostream[-3] + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  pcVar2 = (this->super_cmGlobalGenerator).CMakeInstance;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GHS_BSP_NAME","");
  pcVar7 = cmake::GetCacheDefinition(pcVar2,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  bVar6 = cmSystemTools::IsOff(pcVar7);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>(fout,"    -bsp ",9);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)fout + (int)fout->_vptr_basic_ostream[-3]);
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(fout,pcVar7,sVar8);
    }
    std::ios::widen((char)fout->_vptr_basic_ostream[-3] + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
  }
  bVar6 = cmSystemTools::IsOff((this->OsDir)._M_dataplus._M_p);
  if (bVar6) {
    return;
  }
  pcVar2 = (this->super_cmGlobalGenerator).CMakeInstance;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GHS_OS_DIR_OPTION","");
  pcVar7 = cmake::GetCacheDefinition(pcVar2,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  sVar3 = (this->OsDir)._M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (this->OsDir)._M_dataplus._M_p;
    sVar10 = 0;
    do {
      if (pcVar4[sVar10] == '\\') {
        pcVar4[sVar10] = '/';
      }
      sVar10 = sVar10 + 1;
    } while (sVar3 != sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,"    ",4);
  bVar6 = cmSystemTools::IsOff(pcVar7);
  if (bVar6) {
    pcVar7 = "";
    sVar8 = 0;
  }
  else {
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)fout + (int)fout->_vptr_basic_ostream[-3]);
      goto LAB_001fa153;
    }
    sVar8 = strlen(pcVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,pcVar7,sVar8);
LAB_001fa153:
  std::__ostream_insert<char,std::char_traits<char>>(fout,"\"",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,(this->OsDir)._M_dataplus._M_p,(this->OsDir)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTopLevelProject(std::ostream& fout,
                                                     cmLocalGenerator* root)
{
  this->WriteFileHeader(fout);
  this->WriteMacros(fout, root);
  this->WriteHighLevelDirectives(root, fout);
  GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fout);

  fout << "# Top Level Project File" << std::endl;

  // Specify BSP option if supplied by user
  const char* bspName =
    this->GetCMakeInstance()->GetCacheDefinition("GHS_BSP_NAME");
  if (!cmSystemTools::IsOff(bspName)) {
    fout << "    -bsp " << bspName << std::endl;
  }

  // Specify OS DIR if supplied by user
  // -- not all platforms require this entry in the project file
  if (!cmSystemTools::IsOff(this->OsDir.c_str())) {
    const char* osDirOption =
      this->GetCMakeInstance()->GetCacheDefinition("GHS_OS_DIR_OPTION");
    std::replace(this->OsDir.begin(), this->OsDir.end(), '\\', '/');
    fout << "    ";
    if (cmSystemTools::IsOff(osDirOption)) {
      fout << "";
    } else {
      fout << osDirOption;
    }
    fout << "\"" << this->OsDir << "\"" << std::endl;
  }
}